

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkMarkCone(Wlc_Ntk_t *p,int iCoId,int Range,int fSeq,int fAllPis)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  Vec_Int_t *p_00;
  int iVar3;
  
  Wlc_NtkCleanMarks(p);
  if (fAllPis != 0) {
    for (iVar3 = 0; iVar3 < (p->vPis).nSize; iVar3 = iVar3 + 1) {
      pWVar2 = Wlc_NtkPi(p,iVar3);
      *(byte *)pWVar2 = *(byte *)pWVar2 | 0x80;
    }
  }
  p_00 = Vec_IntAlloc(100);
  for (iVar3 = 0; iVar3 < (p->vCos).nSize; iVar3 = iVar3 + 1) {
    pWVar2 = Wlc_NtkCo(p,iVar3);
    if ((iCoId == -1) || (iVar3 < Range + iCoId && iCoId <= iVar3)) {
      Wlc_NtkMarkCone_rec(p,pWVar2,p_00);
    }
  }
  if (fSeq != 0) {
    for (iVar3 = 0; iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(p_00,iVar3);
      pWVar2 = Wlc_NtkCo(p,(iVar1 + (p->vPos).nSize) - (p->vPis).nSize);
      Wlc_NtkMarkCone_rec(p,pWVar2,p_00);
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Wlc_NtkMarkCone( Wlc_Ntk_t * p, int iCoId, int Range, int fSeq, int fAllPis )
{
    Vec_Int_t * vFlops;
    Wlc_Obj_t * pObj;
    int i, CiId, CoId;
    Wlc_NtkCleanMarks( p );
    if ( fAllPis )
    Wlc_NtkForEachPi( p, pObj, i )
        pObj->Mark = 1;
    vFlops = Vec_IntAlloc( 100 );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( iCoId == -1 || (i >= iCoId && i < iCoId + Range) )
            Wlc_NtkMarkCone_rec( p, pObj, vFlops );
    if ( fSeq )
    Vec_IntForEachEntry( vFlops, CiId, i )
    {
        CoId = Wlc_NtkPoNum(p) + CiId - Wlc_NtkPiNum(p);
        Wlc_NtkMarkCone_rec( p, Wlc_NtkCo(p, CoId), vFlops );
    }
    Vec_IntFree( vFlops );
}